

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall amrex::MLEBABecLap::update(MLEBABecLap *this)

{
  pointer piVar1;
  uint uVar2;
  pointer paVar3;
  pointer paVar4;
  int alev;
  long lVar5;
  long lVar6;
  Real RVar7;
  Real RVar8;
  value_type_conflict local_34;
  
  averageDownCoeffs(this);
  piVar1 = (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_is_singular).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar1) {
    (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar1
    ;
  }
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_is_singular).super_vector<int,_std::allocator<int>_>,
             (long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels,
             &local_34);
  paVar3 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (pointer)std::
                    __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                              (paVar3,paVar3 + 1);
  paVar4 = (pointer)std::
                    __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                              ();
  if ((((paVar3 == (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_lobc.
                   super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                   .
                   super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1) &&
       (paVar4 == (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_hibc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1)) &&
      ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
       *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
        &(((this->m_eb_phi).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
       (MultiFab *)0x0)) &&
     (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels)) {
    lVar6 = 2;
    lVar5 = 0;
    do {
      if ((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_domain_covered.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar5] != 0) {
        uVar2 = 1;
        if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
          RVar7 = MultiFab::sum((MultiFab *)
                                (*(long *)((long)&(((this->m_a_coeffs).
                                                                                                        
                                                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                                  ).
                                                  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                          + lVar6 * 4) + -0x180),0,false);
          RVar8 = MultiFab::norm0((MultiFab *)
                                  (*(long *)((long)&(((this->m_a_coeffs).
                                                                                                            
                                                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                                  ).
                                                  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                            + lVar6 * 4) + -0x180),0,0,false,false);
          uVar2 = (uint)(RVar7 <= RVar8 * 1e-12);
        }
        (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar5] = uVar2;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 6;
    } while (lVar5 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels);
  }
  this->m_needs_update = false;
  return;
}

Assistant:

void
MLEBABecLap::update ()
{
    if (MLCellABecLap::needsUpdate()) MLCellABecLap::update();

    averageDownCoeffs();

    m_is_singular.clear();
    m_is_singular.resize(m_num_amr_levels, false);
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end() && !isEBDirichlet())
    {  // No Dirichlet
        for (int alev = 0; alev < m_num_amr_levels; ++alev)
        {
            if (m_domain_covered[alev])
            {
                if (m_a_scalar == 0.0)
                {
                    m_is_singular[alev] = true;
                }
                else
                {
                    Real asum = m_a_coeffs[alev].back().sum();
                    Real amax = m_a_coeffs[alev].back().norm0();
                    m_is_singular[alev] = (asum <= amax * 1.e-12);
                }
            }
        }
    }

    m_needs_update = false;
}